

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O1

bool soul::containsChar(char *s,char c)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  
  if ((s != (char *)0x0) && (cVar1 = *s, cVar1 != '\0')) {
    pcVar2 = s + 1;
    do {
      bVar3 = cVar1 == c;
      if (bVar3) {
        return bVar3;
      }
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar1 != '\0');
    return bVar3;
  }
  return false;
}

Assistant:

bool containsChar (const char* s, char c) noexcept
{
    if (s == nullptr)
        return false;

    for (; *s != 0; ++s)
        if (*s == c)
            return true;

    return false;
}